

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

void EMIT_OP_RPTR(CodeGenGenericContext *ctx,x86Command op,x86Size size,x86Reg index,int multiplier,
                 x86Reg base,uint shift)

{
  x86Instruction *pxVar1;
  x86Argument arg_00;
  x86Reg xVar2;
  int iVar3;
  x86Reg xVar4;
  ulong uVar5;
  x86Argument arg;
  x86Reg local_80;
  int local_7c;
  x86Reg local_78;
  uint local_74;
  x86Argument local_70;
  x86Argument local_50;
  
  local_80 = base;
  local_7c = multiplier;
  local_78 = index;
  if (ctx->skipTracking == false) {
    CodeGenGenericContext::RedirectAddressComputation(ctx,&local_78,&local_7c,&local_80,&shift);
    ctx->genRegRead[local_80] = true;
    ctx->genRegRead[local_78] = true;
  }
  xVar4 = local_78;
  iVar3 = local_7c;
  xVar2 = local_80;
  local_70.type = argPtr;
  local_70.ptrBase = local_80;
  local_70.ptrIndex = local_78;
  local_70.ptrMult = local_7c;
  local_74 = shift;
  local_70.ptrNum = shift;
  local_70.field_1.ptrSize = size;
  CodeGenGenericContext::MemRead(ctx,&local_70);
  uVar5 = (ulong)(op - o_call);
  if (op - o_call < 0x3c) {
    if ((0x810000000001004U >> (uVar5 & 0x3f) & 1) != 0) {
      arg_00._4_4_ = local_70._4_4_;
      arg_00.type = local_70.type;
      arg_00.field_1.imm64Arg._4_4_ = local_70.field_1.imm64Arg._4_4_;
      arg_00.field_1.ptrSize = local_70.field_1.reg;
      arg_00.ptrIndex = local_70.ptrIndex;
      arg_00.ptrBase = local_70.ptrBase;
      arg_00.ptrNum = local_70.ptrNum;
      arg_00.ptrMult = local_70.ptrMult;
      CodeGenGenericContext::InvalidateAddressValue(ctx,arg_00);
      local_50.type = argNone;
      local_50.field_1.imm64Arg = 0;
      local_50.ptrBase = rNONE;
      local_50.ptrIndex = rNONE;
      local_50.ptrMult = 0;
      local_50.ptrNum = 0;
      CodeGenGenericContext::MemWrite(ctx,&local_70,&local_50);
      goto LAB_002b451e;
    }
    if ((0x100000000000100U >> (uVar5 & 0x3f) & 1) != 0) {
      CodeGenGenericContext::InvalidateDependand(ctx,rEAX);
      ctx->genReg[1].type = argNone;
      ctx->genRegUpdate[1] =
           (int)((ulong)((long)ctx->x86Op - (long)ctx->x86Base) >> 4) * -0x33333333;
      ctx->genRegRead[1] = false;
      CodeGenGenericContext::InvalidateDependand(ctx,rEDX);
      ctx->genReg[4].type = argNone;
      ctx->genRegUpdate[4] =
           (int)((ulong)((long)ctx->x86Op - (long)ctx->x86Base) >> 4) * -0x33333333;
      ctx->genRegRead[1] = true;
      ctx->genRegRead[4] = true;
      goto LAB_002b451e;
    }
    if (uVar5 == 0) {
      if (ctx->skipTracking == false) {
        CodeGenGenericContext::KillUnreadRegisters(ctx);
        CodeGenGenericContext::InvalidateState(ctx);
      }
      goto LAB_002b451e;
    }
  }
  if (1 < op - o_push) {
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x436,
                  "void EMIT_OP_RPTR(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int)"
                 );
  }
LAB_002b451e:
  pxVar1 = ctx->x86Op;
  pxVar1->name = op;
  (pxVar1->argA).type = argPtr;
  (pxVar1->argA).field_1.ptrSize = size;
  pxVar1 = ctx->x86Op;
  (pxVar1->argA).ptrIndex = xVar4;
  (pxVar1->argA).ptrMult = iVar3;
  (pxVar1->argA).ptrBase = xVar2;
  (pxVar1->argA).ptrNum = local_74;
  (pxVar1->argB).type = argNone;
  ctx->x86Op = pxVar1 + 1;
  return;
}

Assistant:

void EMIT_OP_RPTR(CodeGenGenericContext &ctx, x86Command op, x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift)
{
#ifdef NULLC_OPTIMIZE_X86
	if(!ctx.skipTracking)
	{
		ctx.RedirectAddressComputation(index, multiplier, base, shift);

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);
	}

	x86Argument arg = x86Argument(size, index, multiplier, base, shift);

	ctx.MemRead(arg);

	switch(op)
	{
	case o_push:
	case o_pop:
		break;
	case o_neg:
	case o_not:
	case o_neg64:
	case o_not64:
		ctx.InvalidateAddressValue(arg);

		ctx.MemWrite(arg, x86Argument());
		break;
	case o_idiv:
	case o_idiv64:
		ctx.ReadAndModifyRegister(rEAX);
		ctx.ReadAndModifyRegister(rEDX);

		// Implicitly read the result so when one of the registers is killed, it will not remove the instruction (there's room for improvement)
		ctx.ReadRegister(rEAX);
		ctx.ReadRegister(rEDX);
		break;
	case o_call:
		if(ctx.skipTracking)
			break;

		ctx.KillUnreadRegisters();

		ctx.InvalidateState();
		break;
	default:
		assert(!"unknown instruction");
	}
#else
	if(op == o_call)
		ctx.InvalidateState();
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argPtr;
	ctx.x86Op->argA.ptrSize = size;
	ctx.x86Op->argA.ptrIndex = index;
	ctx.x86Op->argA.ptrMult = multiplier;
	ctx.x86Op->argA.ptrBase = base;
	ctx.x86Op->argA.ptrNum = shift;
	ctx.x86Op->argB.type = x86Argument::argNone;
	ctx.x86Op++;
}